

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadNMEADevicex(NMEADEVICE *pNMEADevice)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = NMEADeviceCS;
  pThreadId = NMEADeviceThreadId;
  lVar2 = 0;
  do {
    if (*(NMEADEVICE **)((long)addrsNMEADevice + lVar2 * 2) == pNMEADevice) {
      *(undefined4 *)((long)resNMEADevice + lVar2) = 1;
      *(undefined4 *)((long)bExitNMEADevice + lVar2) = 0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(NMEADeviceThread,pNMEADevice,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadNMEADevicex(NMEADEVICE* pNMEADevice)
{
	int id = 0;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resNMEADevice[id] = EXIT_FAILURE;
	bExitNMEADevice[id] = FALSE;
	InitCriticalSection(&NMEADeviceCS[id]);
	return CreateDefaultThread(NMEADeviceThread, (void*)pNMEADevice, &NMEADeviceThreadId[id]);
}